

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O1

CallFunc * __thiscall ThreadPool::Take(CallFunc *__return_storage_ptr__,ThreadPool *this)

{
  function<void_()> *__x;
  LockGuard lock;
  LockGuard local_20;
  
  LockGuard::LockGuard(&local_20,&this->m_mutex);
  while ((__x = (this->m_tasks).
                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur,
         (this->m_tasks).
         super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
         .super__Deque_impl_data._M_finish._M_cur == __x && (this->m_bRunning == true))) {
    Condition::Wait(&this->m_notEmpty);
  }
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  if (this->m_bRunning == true) {
    std::function<void_()>::operator=(__return_storage_ptr__,__x);
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              (&this->m_tasks);
    Condition::Notify(&this->m_notFull);
  }
  LockGuard::~LockGuard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

ThreadPool::CallFunc ThreadPool::Take()
{
	LockGuard lock(m_mutex);
	while(m_tasks.empty() && m_bRunning)
	{
		m_notEmpty.Wait();
	}
	
	CallFunc retFunc;
	if (m_bRunning)
	{
		retFunc = m_tasks.front();
		m_tasks.pop_front();
		m_notFull.Notify();
	}
	
	return retFunc;
}